

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.hpp
# Opt level: O0

void __thiscall soplex::SoPlexBase<double>::Statistics::clearSolvingData(Statistics *this)

{
  long in_RDI;
  
  (**(code **)(**(long **)(in_RDI + 8) + 0x10))();
  (**(code **)(**(long **)(in_RDI + 0x10) + 0x10))();
  (**(code **)(**(long **)(in_RDI + 0x18) + 0x10))();
  (**(code **)(**(long **)(in_RDI + 0x20) + 0x10))();
  (**(code **)(**(long **)(in_RDI + 0x28) + 0x10))();
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x10))();
  (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))();
  (**(code **)(**(long **)(in_RDI + 0x40) + 0x10))();
  (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))();
  (**(code **)(**(long **)(in_RDI + 0x50) + 0x10))();
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined4 *)(in_RDI + 0x80) = 0;
  *(undefined4 *)(in_RDI + 0x84) = 0;
  *(undefined4 *)(in_RDI + 0x88) = 0;
  *(undefined4 *)(in_RDI + 0x8c) = 0;
  *(undefined8 *)(in_RDI + 0x90) = 0;
  *(undefined8 *)(in_RDI + 0x98) = 0;
  *(undefined8 *)(in_RDI + 0xa0) = 0;
  *(undefined8 *)(in_RDI + 0xa8) = 0;
  *(undefined8 *)(in_RDI + 0xb0) = 0;
  *(undefined4 *)(in_RDI + 0xb8) = 0;
  *(undefined4 *)(in_RDI + 0xbc) = 0;
  *(undefined4 *)(in_RDI + 0xc0) = 0;
  *(undefined4 *)(in_RDI + 0xc4) = 0;
  *(undefined4 *)(in_RDI + 200) = 0;
  *(undefined4 *)(in_RDI + 0xcc) = 0;
  *(undefined4 *)(in_RDI + 0xd0) = 0;
  *(undefined4 *)(in_RDI + 0xd4) = 0;
  *(undefined4 *)(in_RDI + 0xd8) = 0;
  *(undefined4 *)(in_RDI + 0xdc) = 0;
  *(undefined4 *)(in_RDI + 0xe0) = 0;
  *(undefined4 *)(in_RDI + 0xe4) = 0;
  *(undefined4 *)(in_RDI + 0xe8) = 0;
  *(undefined4 *)(in_RDI + 0xec) = 0;
  *(undefined4 *)(in_RDI + 0xf0) = 0;
  *(undefined4 *)(in_RDI + 0xf4) = 0;
  *(undefined4 *)(in_RDI + 0xf8) = 0;
  *(undefined4 *)(in_RDI + 0xfc) = 0;
  *(undefined4 *)(in_RDI + 0x100) = 0;
  *(undefined4 *)(in_RDI + 0x104) = 0;
  *(undefined4 *)(in_RDI + 0x108) = 0;
  *(undefined4 *)(in_RDI + 0x10c) = 0;
  *(undefined4 *)(in_RDI + 0x110) = 0;
  *(undefined4 *)(in_RDI + 0x114) = 0;
  *(undefined4 *)(in_RDI + 0x118) = 0;
  *(undefined4 *)(in_RDI + 0x11c) = 0;
  *(undefined4 *)(in_RDI + 0x120) = 0;
  *(undefined4 *)(in_RDI + 0x124) = 0;
  *(undefined4 *)(in_RDI + 0x128) = 0;
  *(undefined4 *)(in_RDI + 300) = 0;
  *(undefined4 *)(in_RDI + 0x130) = 0;
  *(undefined4 *)(in_RDI + 0x134) = 0;
  *(undefined4 *)(in_RDI + 0x138) = 0;
  *(undefined4 *)(in_RDI + 0x13c) = 0;
  *(undefined4 *)(in_RDI + 0x140) = 0;
  *(undefined8 *)(in_RDI + 0x148) = 0;
  *(undefined8 *)(in_RDI + 0x150) = 0;
  *(undefined8 *)(in_RDI + 0x158) = 0;
  *(undefined8 *)(in_RDI + 0x160) = 0;
  *(undefined8 *)(in_RDI + 0x168) = 0;
  *(undefined8 *)(in_RDI + 0x170) = 0;
  *(undefined4 *)(in_RDI + 0x178) = 0;
  *(undefined4 *)(in_RDI + 0x17c) = 0;
  *(undefined8 *)(in_RDI + 0x180) = 0;
  *(undefined8 *)(in_RDI + 0x188) = 0;
  return;
}

Assistant:

void SoPlexBase<R>::Statistics::clearSolvingData()
{
   solvingTime->reset();
   preprocessingTime->reset();
   simplexTime->reset();
   syncTime->reset();
   transformTime->reset();
   rationalTime->reset();
   initialPrecisionTime->reset();
   extendedPrecisionTime->reset();
   reconstructionTime->reset();
   boostingStepTime->reset();
   multTimeSparse = 0.0;
   multTimeFull = 0.0;
   multTimeColwise = 0.0;
   multTimeUnsetup = 0.0;
   multSparseCalls = 0;
   multFullCalls = 0;
   multColwiseCalls = 0;
   multUnsetupCalls = 0;
   luFactorizationTimeReal = 0.0;
   luSolveTimeReal = 0.0;
   luFactorizationTimeRational = 0.0;
   luSolveTimeRational = 0.0;
   fpTime = 0.0;
   iterations = 0;
   iterationsPrimal = 0;
   iterationsFromBasis = 0;
   iterationsPolish = 0;
   iterationsFP = 0;
   boundflips = 0;
   boostedIterations = 0;
   boostedIterationsPrimal = 0;
   boostedIterationsFromBasis = 0;
   boostedIterationsPolish = 0;
   boostedBoundflips = 0;
   luFactorizationsReal = 0;
   luSolvesReal = 0;
   luFactorizationsRational = 0;
   rationalReconstructions = 0;
   refinements = 0;
   stallRefinements = 0;
   pivotRefinements = 0;
   feasRefinements = 0;
   unbdRefinements = 0;
   precBoosts = 0;
   stallPrecBoosts = 0;
   pivotPrecBoosts = 0;
   feasPrecBoosts = 0;
   unbdPrecBoosts = 0;

   callsReducedProb = 0;
   iterationsInit = 0;
   iterationsRedProb = 0;
   iterationsCompProb = 0;
   numRedProbRows = 0;
   numRedProbCols = 0;
   degenPivotsPrimal = 0;
   degenPivotsDual = 0;
   degenPivotCandPrimal = 0;
   degenPivotCandDual = 0;
   sumDualDegen = 0;
   sumPrimalDegen = 0;
   totalBoundViol = 0;
   totalRowViol = 0;
   maxBoundViol = 0;
   maxRowViol = 0;
   redProbStatus = 0;
   compProbStatus = 0;
   finalCompObj = 0;
   finalBasisCondition = 0;
}